

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ComparePointerArrays(size_t count,ON__UINT_PTR *a,ON__UINT_PTR *b)

{
  uint *index;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  uint stack_buffer [128];
  uint local_238 [130];
  
  index = local_238;
  if (count != 0) {
    if (a == (ON__UINT_PTR *)0x0) {
      return -(uint)(b != (ON__UINT_PTR *)0x0);
    }
    if (b == (ON__UINT_PTR *)0x0) {
      return 1;
    }
    if (count == 1) {
      if ((uint)*a < (uint)*b) {
        return -1;
      }
      return (uint)((uint)*b < (uint)*a);
    }
    if ((count < 0x41) ||
       (index = (uint *)operator_new__(count * 8,(nothrow_t *)&std::nothrow), index != (uint *)0x0))
    {
      ON_Sort(quick_sort,index,a,count,8,Compare_ON__UINT_PTR);
      ON_Sort(quick_sort,index + count,b,count,8,Compare_ON__UINT_PTR);
      uVar1 = 0;
      uVar3 = 1;
      do {
        uVar2 = (uint)((uint)b[(index + count)[uVar1]] < (uint)a[index[uVar1]]);
        if ((uint)a[index[uVar1]] < (uint)b[(index + count)[uVar1]]) {
          uVar2 = 0xffffffff;
        }
      } while ((uVar2 == 0) &&
              (bVar4 = uVar3 < count, uVar1 = uVar3, uVar3 = (ulong)((int)uVar3 + 1), bVar4));
      if (index == local_238) {
        return uVar2;
      }
      operator_delete__(index);
      return uVar2;
    }
  }
  return 0;
}

Assistant:

static int ComparePointerArrays(
  size_t count,
  const ON__UINT_PTR* a,
  const ON__UINT_PTR* b
  )
{
  if (count <= 0)
    return 0;
  if (nullptr == a)
    return ((nullptr == b) ? 0 : -1);
  if (nullptr == b)
    return 1;
  if (1 == count)
    return Compare_ON__UINT_PTR(a, b);

  unsigned int stack_buffer[128];
  unsigned int* adex
    = (2 * count <= sizeof(stack_buffer) / sizeof(stack_buffer[0]))
    ? stack_buffer
    : new (std::nothrow) unsigned int[2 * count];  
  if (nullptr == adex)
    return 0;
  
  unsigned int* bdex = adex + count;
  ON_Sort(ON::sort_algorithm::quick_sort, adex, a, count, sizeof(a[0]), Compare_ON__UINT_PTR);
  ON_Sort(ON::sort_algorithm::quick_sort, bdex, b, count, sizeof(b[0]), Compare_ON__UINT_PTR);
  
  int rc = 0;
  for (unsigned int i = 0; 0 == rc && i < count; i++)
  {
    rc = Compare_ON__UINT_PTR(a + adex[i], b + bdex[i]);
  }

  if (adex != stack_buffer)
    delete[] adex;

  return rc;
}